

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

void attributeDeclDebug(void *ctx,xmlChar *elem,xmlChar *name,int type,int def,xmlChar *defaultValue
                       ,xmlEnumerationPtr tree)

{
  char *__format;
  
  callbacks = callbacks + 1;
  if (defaultValue == (xmlChar *)0x0) {
    __format = "SAX.attributeDecl(%s, %s, %d, %d, NULL, ...)\n";
  }
  else {
    __format = "SAX.attributeDecl(%s, %s, %d, %d, %s, ...)\n";
  }
  fprintf((FILE *)SAXdebug,__format,elem,name,(ulong)(uint)type,def);
  xmlFreeEnumeration(tree);
  return;
}

Assistant:

static void
attributeDeclDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar * elem,
                   const xmlChar * name, int type, int def,
                   const xmlChar * defaultValue, xmlEnumerationPtr tree)
{
    callbacks++;
    if (quiet)
        return;
    if (defaultValue == NULL)
        fprintf(SAXdebug, "SAX.attributeDecl(%s, %s, %d, %d, NULL, ...)\n",
                elem, name, type, def);
    else
        fprintf(SAXdebug, "SAX.attributeDecl(%s, %s, %d, %d, %s, ...)\n",
                elem, name, type, def, defaultValue);
    xmlFreeEnumeration(tree);
}